

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BVHAggregate::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BVHAggregate *this,Ray *ray,
          Float tMax)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  LinearBVHNode *pLVar6;
  float fVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  ulong uVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  optional<pbrt::ShapeIntersection> primSi;
  int nodesToVisit [64];
  bool local_2e5;
  float local_2e4;
  float local_2e0;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_268;
  uint local_260;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_240;
  char local_140;
  int iStack_13c;
  anon_union_4_2_72e6e63f_for_LinearBVHNode_1 aaStack_138 [66];
  
  if (this->nodes == (LinearBVHNode *)0x0) {
    auVar27 = ZEXT1264(ZEXT812(0));
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0xc0) = auVar27;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x80) = auVar27;
    *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar27;
    *(undefined1 (*) [64])&__return_storage_ptr__->optionalValue = auVar27;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    __return_storage_ptr__->set = false;
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = 0x3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    uVar2 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar28._4_4_ = uVar4;
    auVar28._0_4_ = uVar2;
    auVar28._8_8_ = 0;
    _local_258 = vdivps_avx(auVar22,auVar28);
    fVar30 = 1.0 / (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar24._0_12_ = ZEXT812(0);
    auVar24._12_4_ = 0;
    uVar16 = vcmpps_avx512vl(_local_258,auVar24,1);
    auVar22 = vcmpps_avx(_local_258,auVar24,1);
    auVar23._8_4_ = 1;
    auVar23._0_8_ = 0x100000001;
    auVar23._12_4_ = 1;
    auVar22 = vandps_avx512vl(auVar22,auVar23);
    local_268 = vmovlps_avx(auVar22);
    uVar20 = 0;
    bVar21 = (uVar16 & 1) != 0;
    lVar12 = 0;
    if (bVar21) {
      lVar12 = 0xc;
    }
    uVar14 = 0xc;
    if (bVar21) {
      uVar14 = uVar20;
    }
    bVar21 = (uVar16 & 2) != 0;
    lVar15 = 0;
    if (bVar21) {
      lVar15 = 0xc;
    }
    uVar16 = 0xc;
    if (bVar21) {
      uVar16 = uVar20;
    }
    local_260 = (uint)(fVar30 < 0.0);
    local_2e5 = __return_storage_ptr__->set;
    lVar17 = 0;
    uVar10 = 0xc;
    if (fVar30 < 0.0) {
      lVar17 = 0xc;
      uVar10 = uVar20;
    }
    local_2c0 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48);
    local_2c8 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0);
    local_2e4 = *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8);
    local_2d0 = *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200);
    iVar13 = 0;
    uVar11 = 0;
    local_2e0 = tMax;
    do {
      pLVar6 = this->nodes;
      uVar3 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
      uVar5 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
      auVar25._4_4_ = uVar5;
      auVar25._0_4_ = uVar3;
      auVar25._8_8_ = 0;
      auVar22 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar6[iVar13].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + lVar12)
                                     ),ZEXT416(*(uint *)((long)&pLVar6[iVar13].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + lVar15)),0x10);
      auVar22 = vsubps_avx(auVar22,auVar25);
      auVar29._0_4_ = (float)local_258._0_4_ * auVar22._0_4_;
      auVar29._4_4_ = (float)local_258._4_4_ * auVar22._4_4_;
      auVar29._8_4_ = fStack_250 * auVar22._8_4_;
      auVar29._12_4_ = fStack_24c * auVar22._12_4_;
      auVar22 = vinsertps_avx(ZEXT416(*(uint *)((long)&pLVar6[iVar13].bounds.pMin.
                                                       super_Tuple3<pbrt::Point3,_float>.x + uVar14)
                                     ),ZEXT416(*(uint *)((long)&pLVar6[iVar13].bounds.pMin.
                                                                super_Tuple3<pbrt::Point3,_float>.y
                                                        + uVar16)),0x10);
      auVar22 = vsubps_avx(auVar22,auVar25);
      auVar26._0_4_ = (float)local_258._0_4_ * auVar22._0_4_;
      auVar26._4_4_ = (float)local_258._4_4_ * auVar22._4_4_;
      auVar26._8_4_ = fStack_250 * auVar22._8_4_;
      auVar26._12_4_ = fStack_24c * auVar22._12_4_;
      auVar9._8_4_ = 0x3f800003;
      auVar9._0_8_ = 0x3f8000033f800003;
      auVar9._12_4_ = 0x3f800003;
      auVar23 = vmulps_avx512vl(auVar26,auVar9);
      auVar22 = vshufps_avx(auVar23,auVar23,0xe1);
      uVar8 = vcmpps_avx512vl(auVar22,auVar29,1);
      iVar19 = (int)uVar20;
      if ((uVar8 & 3) == 0) {
        auVar22 = vmovshdup_avx(auVar29);
        auVar22 = vmaxss_avx(auVar22,auVar29);
        fVar1 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
        fVar7 = (*(float *)((long)&pLVar6[iVar13].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z +
                           uVar10) - fVar1) * fVar30 * 1.0000004;
        if (fVar7 < auVar22._0_4_) goto LAB_003d5b76;
        auVar24 = vmovshdup_avx(auVar23);
        auVar23 = vminss_avx(auVar24,auVar23);
        fVar1 = (*(float *)((long)&pLVar6[iVar13].bounds.pMin.super_Tuple3<pbrt::Point3,_float>.z +
                           lVar17) - fVar1) * fVar30;
        if (((auVar23._0_4_ < fVar1) ||
            (auVar22 = vmaxss_avx(ZEXT416((uint)fVar1),auVar22), local_2e0 <= auVar22._0_4_)) ||
           (auVar22 = vminss_avx(ZEXT416((uint)fVar7),auVar23), auVar22._0_4_ <= 0.0))
        goto LAB_003d5b76;
        if (pLVar6[iVar13].nPrimitives == 0) {
          if (*(int *)((long)&local_268 + (ulong)pLVar6[iVar13].axis * 4) == 0) {
            uVar20 = (ulong)(iVar19 + 1);
            aaStack_138[iVar19] = pLVar6[iVar13].field_1;
            iVar13 = iVar13 + 1;
          }
          else {
            uVar20 = (ulong)(iVar19 + 1);
            aaStack_138[iVar19].primitivesOffset = iVar13 + 1;
            iVar13 = pLVar6[iVar13].field_1.primitivesOffset;
          }
          goto LAB_003d5b8c;
        }
        if (pLVar6[iVar13].nPrimitives != 0) {
          lVar18 = 0;
          do {
            PrimitiveHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)&local_240.__align,
                       (this->primitives).
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       pLVar6[iVar13].field_1.primitivesOffset + lVar18,ray,local_2e0);
            if (local_140 == '\x01') {
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) =
                   local_240._64_8_;
              (__return_storage_ptr__->optionalValue).__align = local_240.__align;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = local_240._8_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
                   local_240._16_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
                   local_240._24_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
                   local_240._32_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
                   local_240._40_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
                   local_240._48_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
                   local_240._56_8_;
              local_2c0 = local_240._72_8_;
              auVar27._48_8_ = local_240._128_8_;
              auVar27._0_48_ = local_240._80_48_;
              auVar27._56_8_ = local_240._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
                   local_240._128_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) =
                   local_240._136_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
                   local_240._144_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
                   local_240._152_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) =
                   local_240._160_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
                   local_240._168_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
                   local_240._176_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) =
                   local_240._184_8_;
              *(undefined1 (*) [64])((long)&__return_storage_ptr__->optionalValue + 0x50) = auVar27;
              local_2c8 = local_240._192_8_;
              local_2d0 = local_240._200_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) =
                   local_240._240_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
                   local_240._208_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) =
                   local_240._216_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
                   local_240._224_8_;
              *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) =
                   local_240._232_8_;
              local_2e5 = true;
              local_2e4 = (float)local_240._248_4_;
              local_2e0 = (float)local_240._248_4_;
            }
            if (local_140 != '\0') {
              local_140 = '\0';
            }
            lVar18 = lVar18 + 1;
          } while ((uint)lVar18 < (uint)pLVar6[iVar13].nPrimitives);
        }
        if (iVar19 != 0) goto LAB_003d5b7f;
        uVar20 = 0;
        bVar21 = false;
      }
      else {
LAB_003d5b76:
        if (iVar19 == 0) {
          uVar20 = 0;
          bVar21 = false;
        }
        else {
LAB_003d5b7f:
          uVar20 = (ulong)(iVar19 - 1);
          iVar13 = (&iStack_13c)[iVar19];
LAB_003d5b8c:
          bVar21 = true;
        }
      }
      uVar11 = uVar11 + 1;
    } while (bVar21);
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_2c0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = local_2c8;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = local_2d0;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_2e4;
    __return_storage_ptr__->set = local_2e5;
    *(long *)(in_FS_OFFSET + -0x350) = *(long *)(in_FS_OFFSET + -0x350) + (ulong)uVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> BVHAggregate::Intersect(const Ray &ray,
                                                          Float tMax) const {
    if (nodes == nullptr)
        return {};
    pstd::optional<ShapeIntersection> si;
    Vector3f invDir(1 / ray.d.x, 1 / ray.d.y, 1 / ray.d.z);
    int dirIsNeg[3] = {int(invDir.x < 0), int(invDir.y < 0), int(invDir.z < 0)};
    // Follow ray through BVH nodes to find primitive intersections
    int toVisitOffset = 0, currentNodeIndex = 0;
    int nodesToVisit[64];
    int nodesVisited = 0;
    while (true) {
        ++nodesVisited;
        const LinearBVHNode *node = &nodes[currentNodeIndex];
        // Check ray against BVH node
        if (node->bounds.IntersectP(ray.o, ray.d, tMax, invDir, dirIsNeg)) {
            if (node->nPrimitives > 0) {
                // Intersect ray with primitives in leaf BVH node
                for (int i = 0; i < node->nPrimitives; ++i) {
                    pstd::optional<ShapeIntersection> primSi =
                        primitives[node->primitivesOffset + i].Intersect(ray, tMax);
                    if (primSi) {
                        si = primSi;
                        tMax = si->tHit;
                    }
                }
                if (toVisitOffset == 0)
                    break;
                currentNodeIndex = nodesToVisit[--toVisitOffset];

            } else {
                // Put far BVH node on _nodesToVisit_ stack, advance to near node
                if (dirIsNeg[node->axis]) {
                    nodesToVisit[toVisitOffset++] = currentNodeIndex + 1;
                    currentNodeIndex = node->secondChildOffset;
                } else {
                    nodesToVisit[toVisitOffset++] = node->secondChildOffset;
                    currentNodeIndex = currentNodeIndex + 1;
                }
            }
        } else {
            if (toVisitOffset == 0)
                break;
            currentNodeIndex = nodesToVisit[--toVisitOffset];
        }
    }

    bvhNodesVisited += nodesVisited;
    return si;
}